

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int canrev(int x,int y,char (*board) [8],STATE s,int f)

{
  STATE s_00;
  int iVar1;
  int local_30;
  STATE rs;
  int sum;
  int i;
  int f_local;
  STATE s_local;
  char (*board_local) [8];
  int y_local;
  int x_local;
  
  local_30 = 0;
  if ((board[x][y] == '\x04') || (board[x][y] == '\x05')) {
    y_local = 0;
  }
  else if ((((x < 0) || (7 < x)) || (y < 0)) || (7 < y)) {
    y_local = 0;
  }
  else {
    s_00 = WHITE;
    if (s == WHITE) {
      s_00 = BLACK;
    }
    iVar1 = IsChessAround(x,y,board,s_00);
    if (iVar1 != 0) {
      for (rs = EMPTY; (int)rs < 8; rs = rs + WHITE_) {
        iVar1 = revnum(x,y,rs,board,s,f);
        local_30 = iVar1 + local_30;
      }
    }
    y_local = local_30;
  }
  return y_local;
}

Assistant:

int canrev(int x, int y, char board[][SIZE], STATE s, int f) {
    int i, sum = 0;
    if (board[x][y] == WHITE || board[x][y] == BLACK) {
        return 0;
    }
    if (x < 0 || x >= SIZE || y < 0 || y >= SIZE) {
        return 0;
    }
    STATE rs = (s == WHITE ? BLACK : WHITE);
    if (IsChessAround(x, y, board, rs)) {
        for (i = 0; i < 8; i++) {
            sum += revnum(x, y, i, board, s, f);
        }
    }
    return sum;
}